

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watch_list.h
# Opt level: O1

void watch_list_push(watch_list *wl,watcher w,uint is_bin)

{
  uint uVar1;
  watcher wVar2;
  watcher *pwVar3;
  ulong uVar4;
  
  if (wl != (watch_list *)0x0) {
    uVar1 = wl->cap;
    if (wl->size == uVar1) {
      uVar4 = 4;
      if (3 < uVar1) {
        uVar4 = (ulong)((uVar1 >> 1) * 3);
      }
      pwVar3 = (watcher *)realloc(wl->watchers,uVar4 * 8);
      if (pwVar3 == (watcher *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)wl->cap * 9.5367431640625e-07,(double)uVar4 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      else {
        wl->watchers = pwVar3;
        wl->cap = (uint)uVar4;
      }
    }
    uVar1 = wl->size;
    wl->size = uVar1 + 1;
    wl->watchers[uVar1] = w;
    if (is_bin != 0) {
      uVar1 = wl->n_bin;
      if (uVar1 < wl->size) {
        pwVar3 = wl->watchers;
        wVar2 = pwVar3[uVar1];
        pwVar3[uVar1] = pwVar3[wl->size - 1];
        wl->watchers[wl->size - 1] = wVar2;
        wl->n_bin = wl->n_bin + 1;
      }
    }
    return;
  }
  __assert_fail("wl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/watch_list.h"
                ,0x58,"void watch_list_push(struct watch_list *, struct watcher, unsigned int)");
}

Assistant:

static inline void watch_list_push(struct watch_list *wl, struct watcher w, unsigned is_bin)
{
    assert(wl);
    if (wl->size == wl->cap)
        watch_list_grow(wl);
    wl->watchers[wl->size++] = w;
    if (is_bin && wl->size > wl->n_bin) {
        stk_swap(struct watcher, wl->watchers[wl->n_bin], wl->watchers[wl->size - 1]);
        wl->n_bin++;
    }
}